

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O3

void deqp::gls::FboUtil::config::glInitLayered
               (TextureLayered *cfg,GLint depth_divider,Functions *gl)

{
  glTexImage3DFunc p_Var1;
  GLenum GVar2;
  int iVar3;
  TransferFormat TVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  TVar4 = transferImageFormat((ImageFormat *)(cfg + 8));
  if (0 < *(int *)(cfg + 0x18)) {
    iVar3 = *(int *)(cfg + 0x1c);
    uVar7 = *(uint *)(cfg + 0x10);
    uVar9 = *(uint *)(cfg + 0x14);
    iVar5 = 0;
    do {
      p_Var1 = gl->texImage3D;
      GVar2 = glTarget((Image *)cfg);
      (*p_Var1)(GVar2,iVar5,*(GLint *)(cfg + 8),uVar7,uVar9,iVar3,0,TVar4.format,TVar4.dataType,
                (void *)0x0);
      uVar6 = -(uint)(1 < (int)uVar7 / 2);
      uVar8 = -(uint)(1 < (int)uVar9 / 2);
      iVar3 = iVar3 / depth_divider;
      if (iVar3 < 2) {
        iVar3 = 1;
      }
      uVar7 = ~uVar6 & 1 | (int)uVar7 / 2 & uVar6;
      uVar9 = ~uVar8 & 1 | (int)uVar9 / 2 & uVar8;
      iVar5 = iVar5 + 1;
    } while (iVar5 < *(int *)(cfg + 0x18));
  }
  return;
}

Assistant:

static void glInitLayered (const TextureLayered& cfg,
						   GLint depth_divider, const glw::Functions& gl)
{
	const TransferFormat format = transferImageFormat(cfg.internalFormat);
	GLint w = cfg.width;
	GLint h = cfg.height;
	GLint depth = cfg.numLayers;
	for (GLint level = 0; level < cfg.numLevels; level++)
	{
		gl.texImage3D(glTarget(cfg), level, cfg.internalFormat.format, w, h, depth, 0,
					  format.format, format.dataType, DE_NULL);
		w = de::max(1, w / 2);
		h = de::max(1, h / 2);
		depth = de::max(1, depth / depth_divider);
	}
}